

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O0

void verify_vertical_down(Board *board,int row,int col,Ship *ship)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  Ship *ship_local;
  int col_local;
  int row_local;
  Board *board_local;
  
  if (row + ship->length + -1 <= board->row + -1) {
    pvVar2 = std::
             vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&board->matrix,(long)(row + ship->length + -1));
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvVar2,(long)col);
    bVar1 = std::operator==(pvVar3,"~");
    if (bVar1) {
      if (row + ship->length <= board->row + -1) {
        pvVar2 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&board->matrix,(long)(row + ship->length));
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvVar2,(long)col);
        bVar1 = std::operator==(pvVar3,"~");
        if (bVar1) {
          Ship::set_values(ship,row,col,'V',2);
          return;
        }
      }
      if (board->row + -1 < row + ship->length) {
        Ship::set_values(ship,row,col,'V',2);
        return;
      }
      Ship::set_values(ship,row,col,'N',0);
      return;
    }
  }
  Ship::set_values(ship,row,col,'N',0);
  return;
}

Assistant:

void verify_vertical_down( Board *board, int row, int col, Ship *ship )
{

	/*! Verifies whether the current position plus the rest of the ship (size - 1)
	 * 	exceeds the right border of the matrix or touches another ship
	 */
    if( ( row + ship->length - 1 <= board->row - 1 ) and ( board->matrix[row + ship->length - 1][col] == "~"  ) )
    {
        if( ( row + ship->length <= board->row - 1 ) and ( board->matrix[row + ship->length][col] == "~" ) )
        {
            ship->set_values( row, col, 'V', 2 );
        }
        else if( row + ship->length > board->row - 1 )
        {
            ship->set_values( row, col, 'V', 2 );
        }
        else
        {
            ship->set_values( row, col, 'N', 0 );
        }
    }
    else
    {
        ship->set_values( row, col, 'N', 0 );
    }
}